

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

int __thiscall MlmWrap::provideService(MlmWrap *this,char *regExpr)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  ostream *this_00;
  undefined8 in_RSI;
  long in_RDI;
  int rc;
  char *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 local_79 [33];
  string local_58 [32];
  string local_38 [24];
  string *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar1 = *(undefined8 *)(in_RDI + 0x30);
  uVar3 = std::__cxx11::string::c_str();
  iVar2 = mlm_client_set_worker(uVar1,uVar3,in_RSI);
  if (iVar2 != 0) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_79 + 1),"Could not set worker for ",(allocator *)__lhs);
    std::operator+(__lhs,in_stack_ffffffffffffff50);
    error((MlmWrap *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0);
    this_00 = std::operator<<((ostream *)&std::cerr,local_38);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string((string *)(local_79 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_79);
  }
  return iVar2;
}

Assistant:

int MlmWrap::provideService(const char *regExpr){
    int rc = mlm_client_set_worker(client, id.c_str(), regExpr);
    if(rc){
        std::cerr << error(std::string("Could not set worker for ") + regExpr) << std::endl;
    }
    return rc;
}